

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::RenderCustomTexData(ImFontAtlas *this,int pass,void *p_rects)

{
  int *piVar1;
  float *pfVar2;
  char cVar3;
  ushort uVar4;
  float fVar5;
  void *pvVar6;
  long lVar7;
  ImGuiContext *pIVar8;
  void *__dest;
  int y;
  int iVar9;
  int iVar10;
  undefined8 *puVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  ImVec2 cursor_datas [7] [3];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pIVar8 = GImGui;
  if (pass == 1) {
    if (*p_rects < 1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x353,"value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]");
    }
    lVar7 = *(long *)((long)p_rects + 8);
    iVar10 = 0;
    lVar12 = 0;
    do {
      lVar14 = 0;
      do {
        cVar3 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                [(int)lVar12 + lVar14];
        lVar15 = (long)(int)((uint)*(ushort *)(lVar7 + 8) + (int)lVar14 +
                            ((uint)*(ushort *)(lVar7 + 10) + iVar10) * this->TexWidth);
        this->TexPixelsAlpha8[lVar15] = -(cVar3 == '.');
        this->TexPixelsAlpha8[lVar15 + 0x5b] = -(cVar3 == 'X');
        lVar14 = lVar14 + 1;
      } while ((int)lVar14 != 0x5a);
      iVar10 = iVar10 + 1;
      lVar12 = (int)lVar12 + lVar14;
    } while (iVar10 != 0x1b);
    fVar17 = 1.0 / (float)this->TexWidth;
    fVar16 = 1.0 / (float)this->TexHeight;
    uVar4 = *(ushort *)(lVar7 + 10);
    (this->TexUvWhitePixel).x = ((float)*(ushort *)(lVar7 + 8) + 0.5) * fVar17;
    (this->TexUvWhitePixel).y = ((float)uVar4 + 0.5) * fVar16;
    puVar11 = &local_b8;
    local_b8 = 0;
    uStack_b0 = 0x41500000;
    local_a8 = 0x4180000040e00000;
    uStack_a0 = 0x4100000040800000;
    local_98 = 0x41f80000;
    uStack_90 = 0x41b8000041b80000;
    local_88 = 0x4130000041300000;
    uStack_80 = 0x41a80000;
    local_78 = 0x41b8000041100000;
    uStack_70 = 0x4130000040a00000;
    local_68 = 0x41900000425c0000;
    uStack_60 = 0x4110000041b80000;
    local_58 = 0x40a0000041300000;
    uStack_50 = 0x42920000;
    local_48 = 0x4188000041880000;
    uStack_40 = 0x4110000041100000;
    local_38 = 0x425c0000;
    uStack_30 = 0x4188000041880000;
    local_28 = 0x4110000041100000;
    lVar12 = 0x1984;
    lVar14 = 0;
    do {
      pIVar8 = GImGui;
      fVar18 = (float)*(ushort *)(lVar7 + 8) + *(float *)(puVar11 + -2);
      fVar20 = (float)*(ushort *)(lVar7 + 10) + *(float *)((long)puVar11 + -0xc);
      fVar5 = *(float *)(puVar11 + -1);
      fVar19 = *(float *)((long)puVar11 + -4);
      *(int *)((long)(GImGui->IO).KeyMap + lVar12 + -0x34) = (int)lVar14;
      *(float *)((long)(pIVar8->IO).KeyMap + lVar12 + -0x28) = fVar5;
      *(float *)((long)(pIVar8->IO).KeyMap + lVar12 + -0x24) = fVar19;
      *(undefined8 *)((long)(pIVar8->IO).KeyMap + lVar12 + -0x30) = *puVar11;
      fVar21 = fVar16 * fVar20;
      pfVar2 = (float *)((long)(pIVar8->IO).KeyMap + lVar12 + -0x20);
      *pfVar2 = fVar17 * fVar18;
      pfVar2[1] = fVar21;
      pfVar2[2] = fVar17 * (fVar18 + 91.0);
      pfVar2[3] = fVar21;
      fVar19 = (fVar19 + fVar20) * fVar16;
      pfVar2 = (float *)((long)(pIVar8->IO).KeyMap + lVar12 + -0x10);
      *pfVar2 = (fVar18 + fVar5) * fVar17;
      pfVar2[1] = fVar19;
      pfVar2[2] = (fVar18 + 91.0 + fVar5) * fVar17;
      pfVar2[3] = fVar19;
      lVar14 = lVar14 + 1;
      puVar11 = puVar11 + 3;
      lVar12 = lVar12 + 0x34;
    } while (lVar14 != 7);
  }
  else if (pass == 0) {
    iVar10 = *(int *)((long)p_rects + 4);
    if (*p_rects == iVar10) {
      iVar13 = *p_rects + 1;
      if (iVar10 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar10 / 2 + iVar10;
      }
      if (iVar13 < iVar9) {
        iVar13 = iVar9;
      }
      if (iVar10 < iVar13) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (*(pIVar8->IO).MemAllocFn)((long)iVar13 << 4);
        if (*(void **)((long)p_rects + 8) != (void *)0x0) {
          memcpy(__dest,*(void **)((long)p_rects + 8),(long)*p_rects << 4);
        }
        pvVar6 = *(void **)((long)p_rects + 8);
        if (pvVar6 != (void *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pvVar6);
        *(void **)((long)p_rects + 8) = __dest;
        *(int *)((long)p_rects + 4) = iVar13;
      }
    }
    lVar7 = *(long *)((long)p_rects + 8);
    iVar10 = *p_rects;
    *(int *)p_rects = iVar10 + 1;
    lVar12 = (long)iVar10 * 0x10;
    *(undefined8 *)(lVar7 + lVar12) = 0x1c00b500000000;
    *(undefined8 *)(lVar7 + 8 + lVar12) = 0;
  }
  return;
}

Assistant:

void ImFontAtlas::RenderCustomTexData(int pass, void* p_rects)
{
    // A work of art lies ahead! (. = white layer, X = black layer, others are blank)
    // The white texels on the top left are the ones we'll use everywhere in ImGui to render filled shapes.
    const int TEX_DATA_W = 90;
    const int TEX_DATA_H = 27;
    const char texture_data[TEX_DATA_W*TEX_DATA_H+1] =
    {
        "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX"
        "..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X"
        "---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X"
        "X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X"
        "XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X"
        "X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X"
        "X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX"
        "X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      "
        "X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       "
        "X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        "
        "X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         "
        "X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          "
        "X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           "
        "X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            "
        "X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           "
        "X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          "
        "X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          "
        "X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------"
        "X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           "
        "XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -           "
        "      X..X          -  X...X  -         X...X         -  X..X           X..X  -           "
        "       XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           "
        "------------        -    X    -           X           -X.....................X-           "
        "                    ----------------------------------- X...XXXXXXXXXXXXX...X -           "
        "                                                      -  X..X           X..X  -           "
        "                                                      -   X.X           X.X   -           "
        "                                                      -    XX           XX    -           "
    };

    ImVector<stbrp_rect>& rects = *(ImVector<stbrp_rect>*)p_rects;
    if (pass == 0)
    {
        // Request rectangles
        stbrp_rect r;
        memset(&r, 0, sizeof(r));
        r.w = (TEX_DATA_W*2)+1;
        r.h = TEX_DATA_H+1;
        rects.push_back(r);
    }
    else if (pass == 1)
    {
        // Render/copy pixels
        const stbrp_rect& r = rects[0];
        for (int y = 0, n = 0; y < TEX_DATA_H; y++)
            for (int x = 0; x < TEX_DATA_W; x++, n++)
            {
                const int offset0 = (int)(r.x + x) + (int)(r.y + y) * TexWidth;
                const int offset1 = offset0 + 1 + TEX_DATA_W;
                TexPixelsAlpha8[offset0] = texture_data[n] == '.' ? 0xFF : 0x00;
                TexPixelsAlpha8[offset1] = texture_data[n] == 'X' ? 0xFF : 0x00;
            }
        const ImVec2 tex_uv_scale(1.0f / TexWidth, 1.0f / TexHeight);
        TexUvWhitePixel = ImVec2((r.x + 0.5f) * tex_uv_scale.x, (r.y + 0.5f) * tex_uv_scale.y);

        // Setup mouse cursors
        const ImVec2 cursor_datas[ImGuiMouseCursor_Count_][3] =
        {
            // Pos ........ Size ......... Offset ......
            { ImVec2(0,3),  ImVec2(12,19), ImVec2( 0, 0) }, // ImGuiMouseCursor_Arrow
            { ImVec2(13,0), ImVec2(7,16),  ImVec2( 4, 8) }, // ImGuiMouseCursor_TextInput
            { ImVec2(31,0), ImVec2(23,23), ImVec2(11,11) }, // ImGuiMouseCursor_Move
            { ImVec2(21,0), ImVec2( 9,23), ImVec2( 5,11) }, // ImGuiMouseCursor_ResizeNS
            { ImVec2(55,18),ImVec2(23, 9), ImVec2(11, 5) }, // ImGuiMouseCursor_ResizeEW
            { ImVec2(73,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNESW
            { ImVec2(55,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNWSE
        };

        for (int type = 0; type < ImGuiMouseCursor_Count_; type++)
        {
            ImGuiMouseCursorData& cursor_data = GImGui->MouseCursorData[type];
            ImVec2 pos = cursor_datas[type][0] + ImVec2((float)r.x, (float)r.y);
            const ImVec2 size = cursor_datas[type][1];
            cursor_data.Type = type;
            cursor_data.Size = size;
            cursor_data.HotOffset = cursor_datas[type][2];
            cursor_data.TexUvMin[0] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[0] = (pos + size) * tex_uv_scale;
            pos.x += TEX_DATA_W+1;
            cursor_data.TexUvMin[1] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[1] = (pos + size) * tex_uv_scale;
        }
    }
}